

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void * startThread(void *obj)

{
  ThreadData *data;
  void *obj_local;
  
  ThreadData::runInThread((ThreadData *)obj);
  if (obj != (void *)0x0) {
    ThreadData::~ThreadData((ThreadData *)obj);
    operator_delete(obj);
  }
  return (void *)0x0;
}

Assistant:

void* startThread(void* obj) {
  ThreadData* data = static_cast<ThreadData*>(obj);
  data->runInThread();
  delete data;
  return NULL;
}